

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O1

void __thiscall
glcts::TextureCubeMapArraySamplingTest::getSamplingComputeShaderCode
          (TextureCubeMapArraySamplingTest *this,samplerType *sampler_type,
          samplingFunction *sampling_function,string *out_compute_shader_code)

{
  samplingFunction sampling_function_00;
  samplerType sVar1;
  char cVar2;
  int iVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  GLchar *pGVar8;
  int iVar9;
  attributeDefinition *paVar10;
  ostream *poVar11;
  size_t sVar12;
  GLuint n_components;
  char *pcVar13;
  char *__s;
  char *__s_00;
  char *pcVar14;
  long lVar15;
  attributeDefinition *paVar16;
  string sampling_code;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  long local_1c8 [2];
  stringstream stream;
  undefined1 local_1a8 [376];
  
  sampling_code._M_dataplus._M_p = (pointer)&sampling_code.field_2;
  sampling_code._M_string_length = 0;
  sampling_code.field_2._M_local_buf[0] = '\0';
  std::__cxx11::stringstream::stringstream((stringstream *)&stream);
  sampling_function_00 = *sampling_function;
  n_components = 0;
  switch(sampling_function_00) {
  case Texture:
    paVar16 = getAttributes::texture_attributes;
    goto LAB_00d7529d;
  case TextureLod:
    paVar16 = getAttributes::textureLod_attributes;
    iVar9 = 2;
    break;
  case TextureGrad:
    paVar16 = getAttributes::textureGrad_attributes;
    iVar9 = 3;
    break;
  case TextureGather:
    paVar16 = getAttributes::textureGather_attributes;
LAB_00d7529d:
    iVar9 = 1;
    break;
  default:
    bVar7 = false;
    iVar9 = 0;
    paVar16 = (attributeDefinition *)0x0;
    goto LAB_00d752bc;
  }
  bVar7 = true;
LAB_00d752bc:
  sVar1 = *sampler_type;
  paVar10 = (attributeDefinition *)0x0;
  if (sVar1 == Depth) {
    paVar10 = getAttributes::depth_attributes;
  }
  bVar5 = true;
  pcVar13 = (GLchar *)0x0;
  bVar4 = true;
  bVar6 = true;
  pcVar14 = (char *)0x0;
  switch(sVar1) {
  case Float:
    pcVar14 = "samplerCubeArray ";
    n_components = 4;
    pcVar13 = "vec4 ";
    break;
  case Int:
    pcVar14 = "isamplerCubeArray ";
    n_components = 4;
    pcVar13 = "ivec4 ";
    break;
  case UInt:
    pcVar14 = "usamplerCubeArray ";
    n_components = 4;
    pcVar13 = "uvec4 ";
    break;
  case Depth:
    pcVar14 = "samplerCubeArrayShadow ";
    n_components = 1;
    pcVar13 = "float ";
    bVar4 = false;
    goto LAB_00d7539f;
  case Stencil:
    pcVar14 = "usamplerCubeArray ";
    n_components = 1;
    pcVar13 = "uint ";
    break;
  default:
    goto switchD_00d7530b_default;
  }
  bVar4 = true;
LAB_00d7539f:
  bVar6 = false;
switchD_00d7530b_default:
  switch(sVar1) {
  case Float:
  case Depth:
    __s = "rgba8";
    __s_00 = "image2D ";
    break;
  case Int:
    __s = "rgba32i";
    __s_00 = "iimage2D ";
    break;
  case UInt:
    __s = "rgba32ui";
    goto LAB_00d753f4;
  case Stencil:
    __s = "r32ui";
LAB_00d753f4:
    __s_00 = "uimage2D ";
    break;
  default:
    __s_00 = (char *)0x0;
    __s = (char *)0x0;
    goto LAB_00d753fe;
  }
  bVar5 = false;
LAB_00d753fe:
  if (bVar4) {
    getSamplingFunctionCall
              ((TextureCubeMapArraySamplingTest *)&sampling_code,sampling_function_00,pcVar13,
               n_components,"cs_",(GLchar *)0x0,"color",(GLchar *)0x0,"sampler",&sampling_code);
  }
  else {
    getShadowSamplingFunctionCall
              ((TextureCubeMapArraySamplingTest *)&sampling_code,sampling_function_00,pcVar13,
               n_components,"cs_",(GLchar *)0x0,"color",(GLchar *)0x0,"sampler",&sampling_code);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"${VERSION}\n${TEXTURE_CUBE_MAP_ARRAY_REQUIRE}\n\n",0x2e);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"precision highp float;\n",0x17);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"/* Sampling compute shader */",0x1d);
  cVar2 = (char)(ostream *)local_1a8;
  std::ios::widen((char)((Context *)(local_1a8._0_8_ + -0x20))->m_renderCtx + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"uniform ",8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"highp ",6);
  iVar3 = (int)(ostream *)local_1a8;
  if (bVar6) {
    std::ios::clear(iVar3 + (int)((Context *)(local_1a8._0_8_ + -0x20))->m_renderCtx);
  }
  else {
    sVar12 = strlen(pcVar14);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar14,sVar12);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"sampler",7);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,";",1);
  std::ios::widen((char)((Context *)(local_1a8._0_8_ + -0x20))->m_renderCtx + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"layout(",7);
  if (bVar5) {
    std::ios::clear(iVar3 + (int)((Context *)(local_1a8._0_8_ + -0x20))->m_renderCtx);
  }
  else {
    sVar12 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,__s,sVar12);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,") ",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"uniform ",8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"writeonly ",10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"highp ",6);
  if (bVar5) {
    std::ios::clear(iVar3 + (int)((Context *)(local_1a8._0_8_ + -0x20))->m_renderCtx);
  }
  else {
    sVar12 = strlen(__s_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,__s_00,sVar12);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"image",5);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,";",1);
  std::ios::widen((char)((Context *)(local_1a8._0_8_ + -0x20))->m_renderCtx + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  if (bVar7) {
    lVar15 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"layout(std430, binding=",0x17);
      poVar11 = (ostream *)
                std::ostream::operator<<
                          ((ostream *)local_1a8,*(int *)((long)&paVar16->binding + lVar15));
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,") buffer ",9);
      pcVar14 = *(char **)((long)&paVar16->name + lVar15);
      if (pcVar14 == (char *)0x0) {
        std::ios::clear((int)poVar11 + (int)poVar11->_vptr_basic_ostream[-3]);
      }
      else {
        sVar12 = strlen(pcVar14);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,pcVar14,sVar12);
      }
      std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
      std::ostream::put((char)poVar11);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"{\n",2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"    ",4);
      pcVar14 = *(char **)((long)&paVar16->type + lVar15);
      if (pcVar14 == (char *)0x0) {
        std::ios::clear(iVar3 + (int)((Context *)(local_1a8._0_8_ + -0x20))->m_renderCtx);
      }
      else {
        sVar12 = strlen(pcVar14);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar14,sVar12);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
      pcVar14 = *(char **)((long)&paVar16->name + lVar15);
      if (pcVar14 == (char *)0x0) {
        std::ios::clear(iVar3 + (int)((Context *)(local_1a8._0_8_ + -0x20))->m_renderCtx);
      }
      else {
        sVar12 = strlen(pcVar14);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar14,sVar12);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"_data[];\n",9);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"};\n",3);
      lVar15 = lVar15 + 0x18;
    } while ((ulong)(iVar9 + (uint)(iVar9 == 0)) * 0x18 != lVar15);
  }
  if (sVar1 == Depth) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"layout(std430, binding=",0x17);
    poVar11 = (ostream *)
              std::ostream::operator<<
                        ((ostream *)local_1a8,getAttributes::depth_attributes[0].binding);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,") buffer ",9);
    pcVar14 = paVar10->name;
    if (pcVar14 == (char *)0x0) {
      std::ios::clear((int)poVar11 + (int)poVar11->_vptr_basic_ostream[-3]);
    }
    else {
      sVar12 = strlen(pcVar14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,pcVar14,sVar12);
    }
    std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
    std::ostream::put((char)poVar11);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"{\n",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"    ",4);
    pGVar8 = getAttributes::depth_attributes[0].type;
    if (getAttributes::depth_attributes[0].type == (GLchar *)0x0) {
      std::ios::clear(iVar3 + (int)((Context *)(local_1a8._0_8_ + -0x20))->m_renderCtx);
    }
    else {
      sVar12 = strlen(getAttributes::depth_attributes[0].type);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pGVar8,sVar12);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
    pcVar14 = paVar10->name;
    if (pcVar14 == (char *)0x0) {
      std::ios::clear(iVar3 + (int)((Context *)(local_1a8._0_8_ + -0x20))->m_renderCtx);
    }
    else {
      sVar12 = strlen(pcVar14);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar14,sVar12);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"_data[];\n",9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"};\n",3);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,
             "layout (local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n",0x42);
  std::ios::widen((char)((Context *)(local_1a8._0_8_ + -0x20))->m_renderCtx + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,
             "void main()\n{\n    const int face_width         = 3;\n    const int face_height        = 3;\n    const int vertices_per_face  = face_width * face_height;\n    const int faces_per_layer    = 6;\n    const int layer_width        = faces_per_layer * face_width;\n    const int vertices_per_layer = vertices_per_face * faces_per_layer;\n\n    ivec2 image_coord            = ivec2(gl_WorkGroupID.xy);\n    ivec3 texture_size           = textureSize(sampler, 0);\n\n    int layer                    = image_coord.x / layer_width;\n    int layer_offset             = layer * layer_width;\n    int layer_index              = layer * vertices_per_layer;\n    int face                     = (image_coord.x - layer_offset) / face_width;\n    int face_offset              = face * face_width;\n    int face_index               = face * vertices_per_face;\n    int vertex                   = image_coord.x - layer_offset - face_offset;\n    int vertex_index             = layer_index + face_index + vertex + (face_height - image_coord.y - 1) * face_width;\n\n"
             ,0x402);
  if (bVar7) {
    lVar15 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"    ",4);
      pcVar14 = *(char **)((long)&paVar16->type + lVar15);
      if (pcVar14 == (char *)0x0) {
        std::ios::clear(iVar3 + (int)((Context *)(local_1a8._0_8_ + -0x20))->m_renderCtx);
      }
      else {
        sVar12 = strlen(pcVar14);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar14,sVar12);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"cs_",3);
      pcVar14 = *(char **)((long)&paVar16->name + lVar15);
      if (pcVar14 == (char *)0x0) {
        std::ios::clear(iVar3 + (int)((Context *)(local_1a8._0_8_ + -0x20))->m_renderCtx);
      }
      else {
        sVar12 = strlen(pcVar14);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar14,sVar12);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," = ",3);
      pcVar14 = *(char **)((long)&paVar16->name + lVar15);
      if (pcVar14 == (char *)0x0) {
        std::ios::clear(iVar3 + (int)((Context *)(local_1a8._0_8_ + -0x20))->m_renderCtx);
      }
      else {
        sVar12 = strlen(pcVar14);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar14,sVar12);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"_data[vertex_index];",0x14);
      std::ios::widen((char)((Context *)(local_1a8._0_8_ + -0x20))->m_renderCtx + cVar2);
      std::ostream::put(cVar2);
      std::ostream::flush();
      lVar15 = lVar15 + 0x18;
    } while ((ulong)(iVar9 + (uint)(iVar9 == 0)) * 0x18 != lVar15);
  }
  if (sVar1 == Depth) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"    ",4);
    pGVar8 = getAttributes::depth_attributes[0].type;
    if (getAttributes::depth_attributes[0].type == (GLchar *)0x0) {
      std::ios::clear(iVar3 + (int)((Context *)(local_1a8._0_8_ + -0x20))->m_renderCtx);
    }
    else {
      sVar12 = strlen(getAttributes::depth_attributes[0].type);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pGVar8,sVar12);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"cs_",3);
    pcVar14 = paVar10->name;
    if (pcVar14 == (char *)0x0) {
      std::ios::clear(iVar3 + (int)((Context *)(local_1a8._0_8_ + -0x20))->m_renderCtx);
    }
    else {
      sVar12 = strlen(pcVar14);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar14,sVar12);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," = ",3);
    pcVar14 = paVar10->name;
    if (pcVar14 == (char *)0x0) {
      std::ios::clear(iVar3 + (int)((Context *)(local_1a8._0_8_ + -0x20))->m_renderCtx);
    }
    else {
      sVar12 = strlen(pcVar14);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar14,sVar12);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"_data[vertex_index];",0x14);
    std::ios::widen((char)((Context *)(local_1a8._0_8_ + -0x20))->m_renderCtx + cVar2);
    std::ostream::put(cVar2);
    std::ostream::flush();
  }
  std::ios::widen((char)((Context *)(local_1a8._0_8_ + -0x20))->m_renderCtx + cVar2);
  std::ostream::put(cVar2);
  poVar11 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"    ",4);
  if (bVar6) {
    std::ios::clear((int)poVar11 + (int)poVar11->_vptr_basic_ostream[-3]);
  }
  else {
    sVar12 = strlen(pcVar13);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,pcVar13,sVar12);
  }
  pcVar13 = "color";
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"color",5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,";",1);
  std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
  std::ostream::put((char)poVar11);
  std::ostream::flush();
  std::ios::widen((char)((Context *)(local_1a8._0_8_ + -0x20))->m_renderCtx + cVar2);
  std::ostream::put(cVar2);
  poVar11 = (ostream *)std::ostream::flush();
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar11,sampling_code._M_dataplus._M_p,sampling_code._M_string_length);
  std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
  std::ostream::put((char)poVar11);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"    imageStore(image, image_coord, ",0x23);
  if (n_components == 4) {
    lVar15 = 5;
  }
  else {
    if (n_components != 1) goto LAB_00d75f0e;
    if (*sampler_type == Depth) {
      lVar15 = 5;
      pcVar13 = "vec4(";
    }
    else {
      if (*sampler_type != Stencil) goto LAB_00d75f0e;
      lVar15 = 6;
      pcVar13 = "uvec4(";
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar13,lVar15);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"color",5);
    lVar15 = 1;
    pcVar13 = ")";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar13,lVar15);
LAB_00d75f0e:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,");\n",3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"}\n",2);
  std::ios::widen((char)((Context *)(local_1a8._0_8_ + -0x20))->m_renderCtx + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=
            ((string *)out_compute_shader_code,(string *)local_1d8._M_local_buf);
  if ((long *)local_1d8._M_allocated_capacity != local_1c8) {
    operator_delete((void *)local_1d8._M_allocated_capacity,local_1c8[0] + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sampling_code._M_dataplus._M_p != &sampling_code.field_2) {
    operator_delete(sampling_code._M_dataplus._M_p,
                    CONCAT71(sampling_code.field_2._M_allocated_capacity._1_7_,
                             sampling_code.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void TextureCubeMapArraySamplingTest::getSamplingComputeShaderCode(const samplerType&	  sampler_type,
																   const samplingFunction& sampling_function,
																   std::string&			   out_compute_shader_code)
{
	const glw::GLchar*		   color_type					 = 0;
	const glw::GLchar*		   image_type_str				 = 0;
	const glw::GLchar*		   image_layout_str				 = 0;
	const glw::GLchar*		   interpolation_type			 = 0;
	bool					   is_shadow_sampler			 = false;
	glw::GLuint				   n_components					 = 0;
	glw::GLuint				   n_routine_attributes			 = 0;
	glw::GLuint				   n_type_attributes			 = 0;
	const attributeDefinition* routine_attribute_definitions = 0;
	const attributeDefinition* type_attribute_definitions	= 0;
	const glw::GLchar*		   sampler_type_str				 = 0;
	std::string				   sampling_code;
	std::stringstream		   stream;

	/* Get attributes for sampling function */
	getAttributes(sampling_function, routine_attribute_definitions, n_routine_attributes);
	getAttributes(sampler_type, type_attribute_definitions, n_type_attributes);

	/* Get type for color variables */
	getColorType(sampler_type, color_type, interpolation_type, sampler_type_str, image_type_str, image_layout_str,
				 n_components, is_shadow_sampler);

	/* Get sampling code */
	if (false == is_shadow_sampler)
	{
		getSamplingFunctionCall(sampling_function, color_type, n_components, compute_shader_param, 0,
								compute_shader_color, 0, sampler_name, sampling_code);
	}
	else
	{
		getShadowSamplingFunctionCall(sampling_function, color_type, n_components, compute_shader_param, 0,
									  compute_shader_color, 0, sampler_name, sampling_code);
	}

	/* Preamble */
	stream << shader_code_preamble << shader_precision << "/* Sampling compute shader */" << std::endl;

	/* uniform samplerType sampler */
	stream << shader_uniform << "highp " << sampler_type_str << sampler_name << ";" << std::endl;

	/* uniform writeonly image2D image*/
	stream << "layout(" << image_layout_str << ") " << shader_uniform << shader_writeonly << "highp " << image_type_str
		   << image_name << ";" << std::endl;

	/* layout(shared) buffer attribute { type attribute_data[]; }; */
	for (glw::GLuint i = 0; i < n_routine_attributes; ++i)
	{
		stream << compute_shader_layout_binding << routine_attribute_definitions[i].binding << compute_shader_buffer
			   << routine_attribute_definitions[i].name << std::endl;

		stream << "{\n";
		stream << "    " << routine_attribute_definitions[i].type << " " << routine_attribute_definitions[i].name
			   << "_data[];\n";
		stream << "};\n";
	}
	for (glw::GLuint i = 0; i < n_type_attributes; ++i)
	{
		stream << compute_shader_layout_binding << type_attribute_definitions[i].binding << compute_shader_buffer
			   << type_attribute_definitions[i].name << std::endl;

		stream << "{\n";
		stream << "    " << type_attribute_definitions[i].type << " " << type_attribute_definitions[i].name
			   << "_data[];\n";
		stream << "};\n";
	}

	/* layout (local_size_x = 1, local_size_y = 1, local_size_z = 1) in; */
	stream << compute_shader_layout << std::endl;

	/* main + body */
	stream << compute_shader_body;

	/* type cs_attribute = attribute_data[vertex_index] */
	for (glw::GLuint i = 0; i < n_routine_attributes; ++i)
	{
		stream << "    " << routine_attribute_definitions[i].type << compute_shader_param
			   << routine_attribute_definitions[i].name << " = " << routine_attribute_definitions[i].name
			   << "_data[vertex_index];" << std::endl;
	}
	for (glw::GLuint i = 0; i < n_type_attributes; ++i)
	{
		stream << "    " << type_attribute_definitions[i].type << compute_shader_param
			   << type_attribute_definitions[i].name << " = " << type_attribute_definitions[i].name
			   << "_data[vertex_index];" << std::endl;
	}

	/* type color */
	stream << std::endl << "    " << color_type << compute_shader_color << ";" << std::endl;

	/* color = texture*/
	stream << std::endl << sampling_code << std::endl;
	//stream << std::endl << compute_shader_color << " = vec4(cs_grad_x, 255.0);" << std::endl;

	/* imageStore */
	stream << compute_shader_image_store;
	switch (n_components)
	{
	case 1:
		/* imageStore(image, image_coord, color.r);*/
		if (sampler_type == Depth)
		{
			stream << "vec4(" << compute_shader_color << ")";
		}
		else if (sampler_type == Stencil)
		{
			stream << "uvec4(" << compute_shader_color << ")";
		}
		else
		{
			// unexpected case
			DE_ASSERT(false);
		}
		break;
	case 4:
		/* imageStore(image, image_coord, color);*/
		stream << compute_shader_color;
		break;
	};

	stream << ");\n";

	stream << "}\n" << std::endl;

	out_compute_shader_code = stream.str();
}